

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall
spatial_region::film
          (spatial_region *this,double x0,double x1,double ne_y0,double ne_y1,int ions,double cmr,
          double gradwidth,double y0,double y1,double z0,double z1,double T,double vx,
          bool is_profiled,int xnpic_film,int ynpic_film,int znpic_film,
          bool append_for_moving_window,double gradwidth_y)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  int iVar16;
  int i;
  int iVar17;
  ulong uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar21;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double cmr_00;
  undefined1 in_register_00001208 [56];
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar43 [64];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined8 in_XMM10_Qb;
  int_vector3d local_11c;
  double local_110;
  int_vector3d local_104;
  double local_f8;
  double dStack_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  double local_98;
  ulong local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar44._8_56_ = in_register_000012c8;
  auVar44._0_8_ = ne_y1;
  auVar43._8_56_ = in_register_00001288;
  auVar43._0_8_ = ne_y0;
  auVar30._8_56_ = in_register_00001208;
  auVar30._0_8_ = x0;
  local_ac = (undefined4)CONCAT71(in_register_00000011,is_profiled);
  local_11c.i = 0;
  local_11c.j = 0;
  local_11c.k = 0;
  uVar12 = (uint)(x1 / this->dx);
  if (append_for_moving_window) {
    uVar18 = (ulong)(this->nx - 3);
    uVar15 = this->nx - 2;
    local_90 = (ulong)uVar15;
    if ((int)uVar12 < (int)uVar15) {
      local_90 = uVar18;
    }
  }
  else {
    uVar14 = (uint)(x0 / this->dx);
    uVar14 = ~((int)uVar14 >> 0x1f) & uVar14;
    uVar12 = ~((int)uVar12 >> 0x1f) & uVar12;
    uVar15 = this->nx;
    if ((int)uVar15 <= (int)uVar14) {
      uVar14 = uVar15;
    }
    uVar18 = (ulong)uVar14;
    local_90 = (ulong)uVar15;
    if ((int)uVar12 < (int)uVar15) {
      local_90 = (ulong)uVar12;
    }
  }
  if ((int)uVar18 < (int)local_90) {
    auVar20._8_8_ = 0;
    auVar20._0_8_ = vx;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = z1;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = z0;
    local_68 = (double)(((int)(y1 / this->dy) - (int)(y0 / this->dy)) + -3);
    auVar20 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar20,auVar20);
    local_80 = x0 + gradwidth;
    local_c8 = T * cmr;
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    local_a8 = vxorpd_avx512vl(auVar30._0_16_,auVar9);
    local_88 = x0 - gradwidth;
    local_58 = vunpcklpd_avx(auVar44._0_16_,auVar43._0_16_);
    local_48 = vunpcklpd_avx(auVar32,auVar45);
    local_98 = auVar20._0_8_;
    auVar20 = vsqrtsd_avx(auVar20,auVar20);
    local_70 = auVar20._0_8_;
    local_104.i = xnpic_film;
    local_104.j = ynpic_film;
    local_104.k = znpic_film;
    local_e0 = gradwidth;
    local_d0 = cmr;
    local_c0 = y0;
    local_b8 = y1;
    dStack_60 = local_68;
    do {
      dVar21 = this->dy;
      iVar1 = (int)(local_c0 / dVar21) + 1;
      iVar13 = (int)(local_b8 / dVar21);
      iVar17 = (int)uVar18;
      if (iVar1 < iVar13 + -1) {
        local_d8 = (double)iVar17;
        iVar19 = (int)(local_c0 / dVar21);
        do {
          auVar10._8_8_ = this->dz;
          auVar10._0_8_ = this->dz;
          auVar20 = vdivpd_avx512vl(local_48,auVar10);
          auVar33._0_4_ = (int)auVar20._0_8_;
          auVar33._4_4_ = (int)auVar20._8_8_;
          auVar33._8_8_ = 0;
          auVar20 = vpaddd_avx(auVar33,_DAT_00138670);
          iVar16 = auVar20._0_4_;
          if (iVar16 < auVar20._4_4_) {
            auVar20 = vpinsrd_avx(ZEXT416((uint)(iVar19 - (int)(local_c0 / dVar21))),
                                  (iVar13 - iVar19) + -3,1);
            auVar20 = vcvtdq2pd_avx(auVar20);
            auVar22._0_8_ = auVar20._0_8_ * (double)local_58._0_8_;
            auVar22._8_8_ = auVar20._8_8_ * (double)local_58._8_8_;
            auVar11._8_8_ = dStack_60;
            auVar11._0_8_ = local_68;
            auVar20 = vdivpd_avx(auVar22,auVar11);
            local_f8 = auVar20._0_8_ + auVar20._8_8_;
            dStack_f0 = auVar20._0_8_ + auVar20._8_8_;
            local_78 = (double)iVar1;
            do {
              if ((char)local_ac != '\0') {
                auVar23._8_8_ = 0;
                auVar23._0_8_ = this->dy;
                dVar21 = this->dy * (double)this->ny * 0.5;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = local_78;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = dVar21;
                auVar20 = vfmsub132sd_fma(auVar23,auVar34,auVar2);
                dVar21 = auVar20._0_8_ / dVar21;
                local_110 = cos(dVar21 * dVar21 * dVar21 * dVar21 * dVar21 * 1.5707963267948966);
                auVar35._0_8_ = (double)iVar16;
                auVar35._8_8_ = in_XMM10_Qb;
                local_110 = local_110 * local_110;
                auVar24._8_8_ = 0;
                auVar24._0_8_ = this->dz;
                dVar21 = this->dz * (double)this->nz * 0.5;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar21;
                auVar20 = vfmsub213sd_fma(auVar35,auVar24,auVar42);
                dVar21 = auVar20._0_8_ / dVar21;
                dVar21 = cos(dVar21 * dVar21 * dVar21 * dVar21 * dVar21 * 1.5707963267948966);
                local_f8 = local_f8 * dVar21 * dVar21 * local_110;
                dStack_f0 = 0.0;
              }
              if (0.0 <= gradwidth_y) {
                dVar21 = (double)(iVar19 - (int)(local_c0 / this->dy));
                dVar31 = gradwidth_y / this->dy;
                if (dVar21 < dVar31) {
                  local_f8 = local_f8 * (dVar21 / dVar31);
                  dStack_f0 = 0.0;
                }
              }
              if (0.0 <= gradwidth_y) {
                dVar21 = (double)(((int)(local_b8 / this->dy) - iVar19) + -3);
                dVar31 = gradwidth_y / this->dy;
                if (dVar21 < dVar31) {
                  local_f8 = local_f8 * (dVar21 / dVar31);
                  dStack_f0 = 0.0;
                }
              }
              local_11c.j = iVar1;
              local_11c.i = iVar17;
              dVar21 = local_70;
              local_11c.k = iVar16;
              if (local_98 < 0.0) {
                dVar21 = sqrt(local_98);
              }
              local_110 = vx / dVar21;
              dVar21 = this->dx;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = dVar21;
              if (0.0 <= local_e0) {
                if ((int)(local_80 / dVar21) <= iVar17) goto LAB_001139e7;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = local_d8;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_a8._0_8_;
                auVar20 = vfmadd213sd_fma(auVar25,auVar38,auVar5);
                fill_cell_by_particles
                          (this,-1.0,&local_11c,&local_104,(auVar20._0_8_ * local_f8) / local_e0,
                           local_110,0.0,0.0,T);
                if (ions == 2) {
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = this->dx;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = local_d8;
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = local_a8._0_8_;
                  auVar20 = vfmadd213sd_fma(auVar29,auVar41,auVar8);
                  dVar21 = (auVar20._0_8_ * local_f8) / local_e0;
                  goto LAB_00113af3;
                }
                if (ions == 1) {
                  auVar27._8_8_ = 0;
                  auVar27._0_8_ = this->dx;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = local_d8;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_a8._0_8_;
                  auVar20 = vfmadd213sd_fma(auVar27,auVar39,auVar6);
                  dVar21 = (auVar20._0_8_ * local_f8) / local_e0;
                  dVar31 = local_c8;
                  cmr_00 = local_d0;
                  goto LAB_00113b02;
                }
              }
              else if (iVar17 < (int)(local_88 / dVar21)) {
                auVar36._8_8_ = 0;
                auVar36._0_8_ = local_d8;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = local_a8._0_8_;
                auVar20 = vfmadd213sd_fma(auVar25,auVar36,auVar3);
                fill_cell_by_particles
                          (this,-1.0,&local_11c,&local_104,
                           (auVar20._0_8_ / local_e0 + 1.0) * local_f8,local_110,0.0,0.0,T);
                if (ions == 2) {
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = this->dx;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = local_d8;
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_a8._0_8_;
                  auVar20 = vfmadd213sd_fma(auVar28,auVar40,auVar7);
                  dVar21 = (auVar20._0_8_ / local_e0 + 1.0) * local_f8;
LAB_00113af3:
                  dVar31 = T;
                  cmr_00 = 1.0;
                }
                else {
                  if (ions != 1) goto LAB_00113b07;
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ = this->dx;
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = local_d8;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = local_a8._0_8_;
                  auVar20 = vfmadd213sd_fma(auVar26,auVar37,auVar4);
                  dVar21 = (auVar20._0_8_ / local_e0 + 1.0) * local_f8;
                  dVar31 = local_c8;
                  cmr_00 = local_d0;
                }
LAB_00113b02:
                fill_cell_by_particles
                          (this,cmr_00,&local_11c,&local_104,dVar21,local_110,0.0,0.0,dVar31);
              }
              else {
LAB_001139e7:
                fill_cell_by_particles(this,-1.0,&local_11c,&local_104,local_f8,local_110,0.0,0.0,T)
                ;
                dVar21 = local_f8;
                if (ions == 2) goto LAB_00113af3;
                dVar31 = local_c8;
                cmr_00 = local_d0;
                if (ions == 1) goto LAB_00113b02;
              }
LAB_00113b07:
              iVar16 = iVar16 + 1;
            } while (iVar16 < (int)(z1 / this->dz) + -1);
          }
          iVar16 = iVar1 + 1;
          dVar21 = this->dy;
          iVar13 = (int)(local_b8 / dVar21);
          iVar19 = iVar1;
          iVar1 = iVar16;
        } while (iVar16 < iVar13 + -1);
      }
      uVar18 = (ulong)(iVar17 + 1U);
    } while (iVar17 + 1U != (uint)local_90);
  }
  return;
}

Assistant:

void spatial_region::film(double x0, double x1, double ne_y0, double ne_y1, int ions, double
        cmr, double gradwidth, double y0, double y1, double z0, double z1,
        double T, double vx, bool is_profiled,
        int xnpic_film, int ynpic_film, int znpic_film, bool append_for_moving_window, double gradwidth_y)
{ /* x0 - координата левой границы плёнки, x1 - правой, ne -
     концентрация электронов в плёнке, нормированная на критическую
     концентрацию */
    /* gradwidth - толщина части плёнки с линейным ростом плотности от
     * 0 на левой границе плёнки до ne при x0+gradwidth */
    /* при gradwidth<0 плотность плёнки линейно спадает от ne до 0 на
     * участке с градиентом */
    // if is_profiled == 1 then film has transverse envelope
    // ions == 0 - no ions, ions == 1 - use cmr, ions == 2 - positrons

    int_vector3d a,b;
    b.i = xnpic_film;
    b.j = ynpic_film;
    b.k = znpic_film;
    int i0,i1;
    i0 = x0/dx;
    i1 = x1/dx;

    if (append_for_moving_window)
    {
        i0 = nx-3;
        if (i0 < nx-2 && i1 >= nx-2)
        {
            i1 = nx-2;
        }
        else
        {
            i1 = i0; // the for loop is skipped
        }
    }
    else
    {
        if (i0<0) i0 = 0;
        if (i1<0) i1 = 0;
        if (i0>nx) i0 = nx;
        if (i1>nx) i1 = nx;
    }

    double film_ylen = double(int(y1/dy) - int(y0/dy) - 3);
    for(int i=i0;i<i1;i++)
    {
        for(int j=int(y0/dy)+1;j<int(y1/dy)-1;j++)
        {
            double nes = ne_y1 * (j - int(y0/dy) - 1) / film_ylen + ne_y0 * (int(y1/dy) - 2 - j) / film_ylen;
            for(int k=int(z0/dz)+1;k<int(z1/dz)-1;k++)
            {
                if (is_profiled == 1) {
                    double tmp = (j * dy - ny * dy / 2) / (ny * dy / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    double tr_env = tmp * tmp;
                    tmp =  (k * dz - nz * dz / 2) / (nz * dz / 2);
                    tmp = cos(0.5 * PI * tmp * tmp * tmp * tmp * tmp);
                    tr_env *= tmp * tmp;
                    nes *=  tr_env;
                }
                
                if (gradwidth_y >= 0 && j-int(y0/dy)-1 < gradwidth_y/dy) {
                    nes *= (j-int(y0/dy)-1) / (gradwidth_y/dy);
                }
                if (gradwidth_y >= 0 && int(y1/dy)-2-j < gradwidth_y/dy) {
                    nes *= (int(y1/dy)-2-j) / (gradwidth_y/dy);
                }
                //
                a.i = i;
                a.j = j;
                a.k = k;
                double ux0 = vx / sqrt(1 - vx * vx);
                if (gradwidth>=0) {
                    if (i>=int((x0+gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes*(i*dx-x0)/gradwidth, ux0, 0, 0, T);
                    }
                } else {
                    if (i>=int((x0-gradwidth)/dx))
                    {
                        fill_cell_by_particles(-1, a, b, nes, ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes, ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes, ux0, 0, 0, T);
                    }
                    else
                    {
                        fill_cell_by_particles(-1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                        if (ions == 1)
                            fill_cell_by_particles(cmr, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T * cmr);
                        if (ions == 2)
                            fill_cell_by_particles(1, a, b, nes * (1 + (i * dx - x0) / gradwidth), ux0, 0, 0, T);
                    }
                }
            }
        }
    }
}